

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkdetheme.cpp
# Opt level: O2

QPlatformTheme * QKdeTheme::createKdeTheme(void)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char *pcVar4;
  char cVar5;
  int kdeVersion;
  QPlatformTheme *this;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String> *this_00;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QArrayDataPointer<char16_t> local_1c8;
  QArrayDataPointer<char16_t> local_1b0;
  QArrayDataPointer<QString> local_198;
  undefined1 *local_178;
  undefined1 *puStack_170;
  QArrayDataPointer<char16_t> local_168;
  QStringBuilder<QString,_QLatin1String> local_148;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  undefined1 local_b8 [32];
  QArrayDataPointer<char> local_98;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String> local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = &DAT_aaaaaaaaaaaaaaaa;
  qgetenv(local_b8 + 0x20);
  this = (QPlatformTheme *)0x0;
  kdeVersion = QByteArray::toInt((bool *)(local_b8 + 0x20),0);
  if (3 < kdeVersion) {
    if (kdeVersion == 4) {
      local_b8._16_8_ = 0;
      local_b8._0_8_ = (Data *)0x0;
      local_b8._8_8_ = (QString *)0x0;
      local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      qEnvironmentVariable((char *)&local_d8);
      if ((undefined1 *)local_d8.size != (undefined1 *)0x0) {
        QList<QString>::emplaceBack<QString_const&>((QList<QString> *)local_b8,(QString *)&local_d8)
        ;
      }
      local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      qEnvironmentVariable((char *)&local_f8);
      if ((undefined1 *)local_f8.size != (undefined1 *)0x0) {
        QString::split(&local_78,&local_f8,0x3a,1,1);
        QList<QString>::append((QList<QString> *)local_b8,(QList<QString> *)&local_78);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
      }
      local_118.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_118.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_118.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QDir::homePath();
      qVar3 = local_98.size;
      pcVar4 = local_98.ptr;
      local_148.a.d.size = local_168.size;
      local_148.a.d.ptr = local_168.ptr;
      local_148.a.d.d = local_168.d;
      local_168.d = (Data *)0x0;
      local_168.ptr = (char16_t *)0x0;
      local_168.size = 0;
      local_148.b.m_size = 5;
      local_148.b.m_data = "/.kde";
      QStringBuilder<QString,_QLatin1String>::QStringBuilder(&local_78.a,&local_148);
      local_78.b.m_size = qVar3;
      local_78.b.m_data = pcVar4;
      QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>::convertTo<QString>
                ((QString *)&local_118,&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
      QFileInfo::QFileInfo((QFileInfo *)&local_78,(QString *)&local_118);
      cVar5 = QFileInfo::isDir();
      QFileInfo::~QFileInfo((QFileInfo *)&local_78);
      if (cVar5 != '\0') {
        QList<QString>::emplaceBack<QString_const&>
                  ((QList<QString> *)local_b8,(QString *)&local_118);
      }
      local_148.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_148.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_148.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QDir::homePath();
      qVar3 = local_168.size;
      pcVar2 = local_168.ptr;
      pDVar1 = local_168.d;
      local_168.d = (Data *)0x0;
      local_168.ptr = (char16_t *)0x0;
      local_168.size = 0;
      local_78.a.a.d.d._0_4_ = SUB84(pDVar1,0);
      local_78.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar1 >> 0x20);
      local_78.a.a.d.ptr._0_4_ = SUB84(pcVar2,0);
      local_78.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
      local_78.a.a.d.size._0_4_ = (undefined4)qVar3;
      local_78.a.a.d.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
      local_78.a.b.m_size = 5;
      local_78.a.b.m_data = "/.kde";
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_148.a,&local_78.a);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
      QFileInfo::QFileInfo((QFileInfo *)&local_78,(QString *)&local_148);
      cVar5 = QFileInfo::isDir();
      QFileInfo::~QFileInfo((QFileInfo *)&local_78);
      if (cVar5 != '\0') {
        QList<QString>::emplaceBack<QString_const&>((QList<QString> *)local_b8,&local_148.a);
      }
      local_168.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_168.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_168.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.a.a.d.d._0_4_ = 8;
      local_78.a.a.d.d._4_4_ = 0;
      local_78.a.a.d.ptr._0_4_ = 0x617532;
      local_78.a.a.d.ptr._4_4_ = 0;
      local_78.a.a.d.size._0_4_ = (undefined4)local_98.size;
      local_78.a.a.d.size._4_4_ = (undefined4)((ulong)local_98.size >> 0x20);
      local_78.a.b.m_size = (qsizetype)local_98.ptr;
      local_78.a.b.m_data = (char *)0x2;
      local_78.b.m_size = 0x5fea6a;
      QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_QLatin1String>::
      convertTo<QString>((QString *)&local_168,
                         (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_QLatin1String>
                          *)&local_78);
      QFileInfo::QFileInfo((QFileInfo *)&local_78,(QString *)&local_168);
      cVar5 = QFileInfo::isReadable();
      QFileInfo::~QFileInfo((QFileInfo *)&local_78);
      if (cVar5 != '\0') {
        local_178 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_170 = &DAT_aaaaaaaaaaaaaaaa;
        QSettings::QSettings((QSettings *)&local_178,(QString *)&local_168,IniFormat,(QObject *)0x0)
        ;
        local_78.a.a.d.d._0_4_ = 0;
        local_78.a.a.d.d._4_4_ = 0;
        local_198.d = (Data *)0x0;
        local_198.ptr = (QString *)0x0;
        local_198.size = 0;
        local_78.a.a.d.ptr._0_4_ = 0x6177fe;
        local_78.a.a.d.ptr._4_4_ = 0;
        local_78.a.a.d.size._0_4_ = 0x13;
        local_78.a.a.d.size._4_4_ = 0;
        QVar6.m_size = (size_t)L"Directories-default";
        QVar6.field_0.m_data_utf8 = (char *)&local_178;
        QSettings::beginGroup(QVar6);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
        local_1b0.d = (Data *)0x0;
        local_1c8.d = (Data *)0x0;
        local_1c8.ptr = (char16_t *)0x0;
        local_1c8.size = 0;
        local_1b0.ptr = L"prefixes";
        local_1b0.size = 8;
        QVar7.m_size = (size_t)&local_178;
        QVar7.field_0.m_data = &local_78;
        QSettings::value(QVar7);
        ::QVariant::toStringList();
        QList<QString>::append((QList<QString> *)local_b8,(QList<QString> *)&local_198);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_198);
        ::QVariant::~QVariant((QVariant *)&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
        QSettings::~QSettings((QSettings *)&local_178);
      }
      local_198.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_198.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_198.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.a.a.d.d._0_4_ = 8;
      local_78.a.a.d.d._4_4_ = 0;
      local_78.a.a.d.ptr._0_4_ = 0x617532;
      local_78.a.a.d.ptr._4_4_ = 0;
      local_78.a.a.d.size._0_4_ = (undefined4)local_98.size;
      local_78.a.a.d.size._4_4_ = (undefined4)((ulong)local_98.size >> 0x20);
      local_78.a.b.m_size = (qsizetype)local_98.ptr;
      QStringBuilder<QLatin1String,_QLatin1String>::convertTo<QString>
                ((QString *)&local_198,(QStringBuilder<QLatin1String,_QLatin1String> *)&local_78);
      QFileInfo::QFileInfo((QFileInfo *)&local_78,(QString *)&local_198);
      cVar5 = QFileInfo::isDir();
      QFileInfo::~QFileInfo((QFileInfo *)&local_78);
      if (cVar5 != '\0') {
        QList<QString>::emplaceBack<QString_const&>
                  ((QList<QString> *)local_b8,(QString *)&local_198);
      }
      QtPrivate::QStringList_removeDuplicates((QList_conflict1 *)local_b8);
      if (local_b8._16_8_ == 0) {
        local_78.a.a.d.d._0_4_ = 2;
        local_78.a.a.d.size._4_4_ = 0;
        local_78.a.a.d.d._4_4_ = 0;
        local_78.a.a.d.ptr._0_4_ = 0;
        local_78.a.a.d.ptr._4_4_ = 0;
        local_78.a.a.d.size._0_4_ = 0;
        local_78.a.b.m_size = 0x5efe3e;
        this = (QPlatformTheme *)0x0;
        QMessageLogger::warning((char *)&local_78,"Unable to determine KDE dirs");
      }
      else {
        this = (QPlatformTheme *)operator_new(0x10);
        QKdeTheme((QKdeTheme *)this,(QStringList *)local_b8,4);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      this_00 = (QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String> *)local_b8;
    }
    else {
      this = (QPlatformTheme *)operator_new(0x10);
      this_00 = &local_78;
      QStandardPaths::standardLocations((StandardLocation)this_00);
      QKdeTheme((QKdeTheme *)this,(QStringList *)this_00,kdeVersion);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)this_00);
  }
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(local_b8 + 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformTheme *QKdeTheme::createKdeTheme()
{
    const QByteArray kdeVersionBA = qgetenv("KDE_SESSION_VERSION");
    const int kdeVersion = kdeVersionBA.toInt();
    if (kdeVersion < 4)
        return nullptr;

    if (kdeVersion > 4)
        // Plasma 5 follows XDG spec
        // but uses the same config file format:
        return new QKdeTheme(QStandardPaths::standardLocations(QStandardPaths::GenericConfigLocation), kdeVersion);

    // Determine KDE prefixes in the following priority order:
    // - KDEHOME and KDEDIRS environment variables
    // - ~/.kde(<version>)
    // - read prefixes from /etc/kde<version>rc
    // - fallback to /etc/kde<version>

    QStringList kdeDirs;
    const QString kdeHomePathVar = qEnvironmentVariable("KDEHOME");
    if (!kdeHomePathVar.isEmpty())
        kdeDirs += kdeHomePathVar;

    const QString kdeDirsVar = qEnvironmentVariable("KDEDIRS");
    if (!kdeDirsVar.isEmpty())
        kdeDirs += kdeDirsVar.split(u':', Qt::SkipEmptyParts);

    const QString kdeVersionHomePath = QDir::homePath() + "/.kde"_L1 + QLatin1StringView(kdeVersionBA);
    if (QFileInfo(kdeVersionHomePath).isDir())
        kdeDirs += kdeVersionHomePath;

    const QString kdeHomePath = QDir::homePath() + "/.kde"_L1;
    if (QFileInfo(kdeHomePath).isDir())
        kdeDirs += kdeHomePath;

    const QString kdeRcPath = "/etc/kde"_L1 + QLatin1StringView(kdeVersionBA) + "rc"_L1;
    if (QFileInfo(kdeRcPath).isReadable()) {
        QSettings kdeSettings(kdeRcPath, QSettings::IniFormat);
        kdeSettings.beginGroup(QStringLiteral("Directories-default"));
        kdeDirs += kdeSettings.value(QStringLiteral("prefixes")).toStringList();
    }

    const QString kdeVersionPrefix = "/etc/kde"_L1 + QLatin1StringView(kdeVersionBA);
    if (QFileInfo(kdeVersionPrefix).isDir())
        kdeDirs += kdeVersionPrefix;

    kdeDirs.removeDuplicates();
    if (kdeDirs.isEmpty()) {
        qWarning("Unable to determine KDE dirs");
        return nullptr;
    }

    return new QKdeTheme(kdeDirs, kdeVersion);
}